

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O1

void __thiscall
Enterprise::ConcreteMachine<true,true>::page<2ul>(ConcreteMachine<true,true> *this,uint8_t offset)

{
  ConcreteMachine<true,true> *pCVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  this[0x6016a] = (ConcreteMachine<true,true>)offset;
  iVar2 = (int)CONCAT71(in_register_00000031,offset);
  if (offset < 4) {
    pCVar1 = this + (ulong)(uint)(iVar2 << 0xe) + 0x38120;
  }
  else if (offset == ' ') {
    pCVar1 = this + 0x4c120;
  }
  else if (offset == '\x10') {
    pCVar1 = this + 0x48120;
  }
  else {
    if ((offset & 0xfe) != 0x30) {
      if (offset < (byte)this[0x60120]) {
        pCVar1 = (ConcreteMachine<true,true> *)0x0;
      }
      else {
        this[0x60172] = (ConcreteMachine<true,true>)(0xfb < offset);
        pCVar1 = this + ((ulong)(uint)(iVar2 << 0xe) - 0x3c7ee0);
      }
      *(ConcreteMachine<true,true> **)(this + 0x60138) = pCVar1;
      *(ConcreteMachine<true,true> **)(this + 0x60158) = pCVar1;
      return;
    }
    pCVar1 = this + (ulong)(iVar2 * 0x4000 - 0xc0000) + 0x50120;
  }
  *(ConcreteMachine<true,true> **)(this + 0x60138) = pCVar1;
  *(undefined8 *)(this + 0x60158) = 0;
  this[0x60172] = (ConcreteMachine<true,true>)0x0;
  return;
}

Assistant:

void page(uint8_t offset) {
			pages_[slot] = offset;

#define Map(location, source)												\
	if(offset >= location && offset < location + source.size() / 0x4000) {	\
		page<slot>(&source[(offset - location) * 0x4000], nullptr);			\
		is_video_[slot] = false;											\
		return;																\
	}

			Map(0, exos_);
			Map(16, basic_);
			Map(32, exdos_rom_);
			Map(48, epdos_rom_);

#undef Map

			// Of whatever size of RAM I've declared above, use only the final portion.
			// This correlated with Nick always having been handed the final 64kb and,
			// at least while the RAM is the first thing declared above, does a little
			// to benefit data locality. Albeit not in a useful sense.
			if(offset >= min_ram_slot_) {
				const auto ram_floor = 4194304 - ram_.size();
				const size_t address = offset * 0x4000 - ram_floor;
				is_video_[slot] = offset >= 0xfc;	// TODO: this hard-codes a 64kb video assumption.
				page<slot>(&ram_[address], &ram_[address]);
				return;
			}

			page<slot>(nullptr, nullptr);
		}